

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void __thiscall Board::deplace(Board *this,Block *block)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = block->t;
  iVar2 = block->o;
  lVar5 = 0;
  do {
    lVar3 = (long)blockShape[iVar1][iVar2][lVar5 * 2] + (long)block->x;
    lVar4 = (long)*(int *)((long)iVar2 * 0x20 + (long)iVar1 * 0x80 + 0x11dd94 + lVar5 * 8) +
            (long)block->y;
    this->rows[lVar3] = this->rows[lVar3] ^ 1 << ((byte)lVar4 & 0x1f);
    this->cols[lVar4] = this->cols[lVar4] ^ 1 << ((byte)lVar3 & 0x1f);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

void Board::deplace(const Block &block){
    int i, tmpX, tmpY;
    auto shape = blockShape[block.t][block.o];
    for (i = 0; i < 4; ++i) {
        tmpX = block.x + shape[2 * i];
        tmpY = block.y + shape[2 * i + 1];
        rows[tmpX] ^= 1 << tmpY;
        cols[tmpY] ^= 1 << tmpX;
    }
}